

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall
SoftHSM::C_SetAttributeValue
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_OBJECT_HANDLE hObject,
          CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount)

{
  P11Object *pPVar1;
  int iVar2;
  int iVar3;
  Session *this_00;
  Token *token;
  OSObject *object;
  CK_STATE sessionState;
  CK_RV CVar4;
  P11Object *p11object;
  P11Object *local_38;
  
  CVar4 = 400;
  if (this->isInitialised == true) {
    if (pTemplate == (CK_ATTRIBUTE_PTR)0x0) {
      CVar4 = 7;
    }
    else {
      this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
      if (this_00 == (Session *)0x0) {
        CVar4 = 0xb3;
      }
      else {
        token = Session::getToken(this_00);
        if (token == (Token *)0x0) {
          CVar4 = 5;
        }
        else {
          object = (OSObject *)HandleManager::getObject(this->handleManager,hObject);
          CVar4 = 0x82;
          if (object != (OSObject *)0x0) {
            iVar2 = (*object->_vptr_OSObject[10])(object);
            if ((char)iVar2 != '\0') {
              iVar2 = (*object->_vptr_OSObject[4])(object,1,0);
              iVar3 = (*object->_vptr_OSObject[4])(object,2,1);
              sessionState = Session::getState(this_00);
              CVar4 = haveWrite(sessionState,(CK_BBOOL)iVar2,SUB41(iVar3,0));
              if (CVar4 == 0) {
                iVar2 = (*object->_vptr_OSObject[4])(object,0x170,1);
                CVar4 = 0x1b;
                if ((char)iVar2 != '\0') {
                  local_38 = (P11Object *)0x0;
                  CVar4 = newP11Object(object,&local_38);
                  pPVar1 = local_38;
                  if (CVar4 == 0) {
                    CVar4 = P11Object::saveTemplate
                                      (local_38,token,SUB41(iVar3,0),pTemplate,ulCount,5);
                    (*pPVar1->_vptr_P11Object[1])(pPVar1);
                  }
                }
              }
              else if (CVar4 == 0xb5) {
                softHSMLog(6,"C_SetAttributeValue",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0x779,"Session is read-only");
                CVar4 = 0xb5;
              }
              else if (CVar4 == 0x101) {
                softHSMLog(6,"C_SetAttributeValue",
                           "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                           ,0x777,"User is not authorized");
                CVar4 = 0x101;
              }
            }
          }
        }
      }
    }
  }
  return CVar4;
}

Assistant:

CK_RV SoftHSM::C_SetAttributeValue(CK_SESSION_HANDLE hSession, CK_OBJECT_HANDLE hObject, CK_ATTRIBUTE_PTR pTemplate, CK_ULONG ulCount)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pTemplate == NULL) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the object handle.
	OSObject *object = (OSObject *)handleManager->getObject(hObject);
	if (object == NULL_PTR || !object->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL isOnToken = object->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isPrivate = object->getBooleanValue(CKA_PRIVATE, true);

	// Check user credentials
	CK_RV rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Check if the object is modifiable
	CK_BBOOL isModifiable = object->getBooleanValue(CKA_MODIFIABLE, true);
	if (!isModifiable) return CKR_ACTION_PROHIBITED;

	// Wrap a P11Object around the OSObject so we can access the attributes in the
	// context of the object in which it is defined.
	P11Object* p11object = NULL;
	rv = newP11Object(object,&p11object);
	if (rv != CKR_OK)
		return rv;

	// Ask the P11Object to save the template with attribute values.
	rv = p11object->saveTemplate(token, isPrivate != CK_FALSE, pTemplate,ulCount,OBJECT_OP_SET);
	delete p11object;
	return rv;
}